

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O0

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunindextype i;
  sunrealtype *Ydot;
  sunrealtype *Y;
  sunindextype N;
  UserData udata;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  long lVar4;
  void *pvVar5;
  undefined4 local_4;
  
  lVar1 = *in_RDX;
  pvVar5 = (void *)0x0;
  lVar3 = N_VGetArrayPointer(in_RDI);
  iVar2 = check_retval(pvVar5,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (iVar2 == 0) {
    pvVar5 = (void *)N_VGetArrayPointer(in_RSI);
    iVar2 = check_retval(pvVar5,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if (iVar2 == 0) {
      for (lVar4 = 0; lVar4 < lVar1; lVar4 = lVar4 + 1) {
        *(double *)((long)pvVar5 + lVar4 * 8) =
             *(double *)(lVar3 + lVar4 * 8) * *(double *)(lVar3 + lVar4 * 8) *
             (1.0 - *(double *)(lVar3 + lVar4 * 8));
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set variable shortcuts */
  sunrealtype *Y = NULL, *Ydot = NULL;
  sunindextype i;

  /* access state array data */
  Y = N_VGetArrayPointer(y);
  if (check_retval((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }

  /* access RHS array data */
  Ydot = N_VGetArrayPointer(ydot);
  if (check_retval((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing reaction term */
  for (i = 0; i < N; i++) { Ydot[i] = Y[i] * Y[i] * (SUN_RCONST(1.0) - Y[i]); }

  /* Return with success */
  return 0;
}